

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool DeleteCoinsDBFromDisk(path *db_path,bool is_snapshot)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string local_a0;
  path local_80;
  string path_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,is_snapshot) != 0) {
    std::filesystem::__cxx11::path::path(&local_80,&db_path->super_path);
    fs::operator/((path *)&path_str,(path *)&local_80,(path *)node::SNAPSHOT_BLOCKHASH_FILENAME);
    std::filesystem::__cxx11::path::~path(&local_80);
    cVar2 = std::filesystem::remove((path *)&path_str);
    if (cVar2 == '\0') {
      std::filesystem::__cxx11::path::string(&local_a0,(path *)node::SNAPSHOT_BLOCKHASH_FILENAME);
      logging_function._M_str = "DeleteCoinsDBFromDisk";
      logging_function._M_len = 0x15;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x15f8,ALL,Info,(ConstevalFormatString<1U>)0x6c85a0,
                 &local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::filesystem::__cxx11::path::~path((path *)&path_str);
  }
  std::filesystem::__cxx11::path::string(&path_str,&db_path->super_path);
  logging_function_00._M_str = "DeleteCoinsDBFromDisk";
  logging_function_00._M_len = 0x15;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_00._M_len = 0x5e;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x1601,ALL,Info,(ConstevalFormatString<1U>)0x6c8609,
             &path_str);
  bVar3 = DestroyDB(&path_str);
  if (bVar3) {
    bVar3 = std::filesystem::exists(&db_path->super_path);
    bVar3 = !bVar3;
  }
  else {
    logging_function_01._M_str = "DeleteCoinsDBFromDisk";
    logging_function_01._M_len = 0x15;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_01._M_len = 0x5e;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,0x1608,ALL,Info,
               (ConstevalFormatString<1U>)0x6c8625,&path_str);
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&path_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);

    if (is_snapshot) {
        fs::path base_blockhash_path = db_path / node::SNAPSHOT_BLOCKHASH_FILENAME;

        try {
            bool existed = fs::remove(base_blockhash_path);
            if (!existed) {
                LogPrintf("[snapshot] snapshot chainstate dir being removed lacks %s file\n",
                          fs::PathToString(node::SNAPSHOT_BLOCKHASH_FILENAME));
            }
        } catch (const fs::filesystem_error& e) {
            LogPrintf("[snapshot] failed to remove file %s: %s\n",
                    fs::PathToString(base_blockhash_path), fsbridge::get_filesystem_error_message(e));
        }
    }

    std::string path_str = fs::PathToString(db_path);
    LogPrintf("Removing leveldb dir at %s\n", path_str);

    // We have to destruct before this call leveldb::DB in order to release the db
    // lock, otherwise `DestroyDB` will fail. See `leveldb::~DBImpl()`.
    const bool destroyed = DestroyDB(path_str);

    if (!destroyed) {
        LogPrintf("error: leveldb DestroyDB call failed on %s\n", path_str);
    }

    // Datadir should be removed from filesystem; otherwise initialization may detect
    // it on subsequent statups and get confused.
    //
    // If the base_blockhash_path removal above fails in the case of snapshot
    // chainstates, this will return false since leveldb won't remove a non-empty
    // directory.
    return destroyed && !fs::exists(db_path);
}